

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

void __thiscall xray_re::xr_ogf_v3::load_s_ikdata(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  uint32_t uVar2;
  pointer ppxVar3;
  xr_bone *pxVar4;
  uint8_t *puVar5;
  float *pfVar6;
  long lVar7;
  uint32_t *puVar8;
  s_bone_shape *psVar9;
  s_joint_ik_data *psVar10;
  pointer ppxVar11;
  byte bVar12;
  
  bVar12 = 0;
  ppxVar11 = (this->super_xr_ogf).super_xr_object.m_bones.
             super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppxVar3 = (this->super_xr_ogf).super_xr_object.m_bones.
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppxVar11 == ppxVar3) {
      pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 3);
      *pbVar1 = *pbVar1 | 2;
      return;
    }
    pxVar4 = *ppxVar11;
    xr_reader::r_sz(r,&pxVar4->m_gamemtl);
    puVar8 = (r->field_2).m_p_u32;
    psVar9 = &pxVar4->m_shape;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar2 = *puVar8;
      psVar9->type = (short)uVar2;
      psVar9->flags = (short)(uVar2 >> 0x10);
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      psVar9 = (s_bone_shape *)((long)psVar9 + (ulong)bVar12 * -8 + 4);
    }
    puVar5 = (r->field_2).m_p;
    (r->field_2).m_p_u32 = (uint32_t *)(puVar5 + 0x70);
    puVar8 = (uint32_t *)(puVar5 + 0x70);
    psVar10 = &pxVar4->m_joint_ik_data;
    for (lVar7 = 0x13; lVar7 != 0; lVar7 = lVar7 + -1) {
      psVar10->type = *puVar8;
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      psVar10 = (s_joint_ik_data *)((long)psVar10 + (ulong)bVar12 * -8 + 4);
    }
    (r->field_2).m_p = (r->field_2).m_p + 0x4c;
    (pxVar4->m_joint_ik_data).friction = 0.0;
    puVar5 = (r->field_2).m_p;
    (r->field_2).m_p = puVar5 + -4;
    if (r->m_end < puVar5 + -4) break;
    (r->field_2).m_p = puVar5;
    (pxVar4->m_bind_rotate).field_0.field_0.x = *(float *)(puVar5 + -4);
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_bind_rotate).field_0.field_0.y = *pfVar6;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_bind_rotate).field_0.field_0.z = *pfVar6;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_bind_offset).field_0.field_0.x = *pfVar6;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_bind_offset).field_0.field_0.y = *pfVar6;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_bind_offset).field_0.field_0.z = *pfVar6;
    pxVar4->m_bind_length = 0.5;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    pxVar4->m_mass = *pfVar6;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_center_of_mass).field_0.field_0.x = *pfVar6;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_center_of_mass).field_0.field_0.y = *pfVar6;
    pfVar6 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar6 + 1);
    (pxVar4->m_center_of_mass).field_0.field_0.z = *pfVar6;
    ppxVar11 = ppxVar11 + 1;
  }
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7c,"void xray_re::xr_reader::advance(size_t)");
}

Assistant:

void xr_ogf_v3::load_s_ikdata(xr_reader& r)
{
	for (xr_bone_vec_it it = m_bones.begin(), end = m_bones.end(); it != end; ++it)
		static_cast<bone_io*>(*it)->import_ikdata(r);
	set_chunk_loaded(OGF3_S_IKDATA);
}